

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O2

int32_t __thiscall icu_63::HebrewCalendar::yearType(HebrewCalendar *this,int32_t year)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x23])();
  if (0x17c < iVar1) {
    iVar1 = iVar1 + -0x1e;
  }
  uVar2 = iVar1 - 0x161;
  if (2 < uVar2) {
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

int32_t HebrewCalendar::yearType(int32_t year) const
{
    int32_t yearLength = handleGetYearLength(year);

    if (yearLength > 380) {
        yearLength -= 30;        // Subtract length of leap month.
    }

    int type = 0;

    switch (yearLength) {
  case 353:
      type = 0; break;
  case 354:
      type = 1; break;
  case 355:
      type = 2; break;
  default:
      //throw new RuntimeException("Illegal year length " + yearLength + " in year " + year);
      type = 1;
    }
    return type;
}